

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# min_sum.cpp
# Opt level: O0

int si9ma::MinSum::merge(int *arr,int L,int M,int R)

{
  long lVar1;
  uint uVar2;
  int aiStack_68 [4];
  int local_58;
  int local_44;
  int i;
  unsigned_long __vla_expr0;
  int local_30;
  int res;
  int tmp_arr_len;
  int tmp_ptr;
  int right_ptr;
  int left_ptr;
  int R_local;
  int M_local;
  int L_local;
  int *arr_local;
  
  tmp_arr_len = M + 1;
  res = 0;
  uVar2 = (R - L) + 1;
  local_30 = 0;
  lVar1 = -0x68 - ((ulong)uVar2 * 4 + 0xf & 0xfffffffffffffff0);
  tmp_ptr = L;
  while (tmp_ptr <= M && tmp_arr_len <= R) {
    if (arr[tmp_ptr] < arr[tmp_arr_len]) {
      local_58 = arr[tmp_ptr] * ((R - tmp_arr_len) + 1);
    }
    else {
      local_58 = 0;
    }
    local_30 = local_58 + local_30;
    if (arr[tmp_ptr] < arr[tmp_arr_len]) {
      aiStack_68[3] = arr[tmp_ptr];
      tmp_ptr = tmp_ptr + 1;
    }
    else {
      aiStack_68[3] = arr[tmp_arr_len];
      tmp_arr_len = tmp_arr_len + 1;
    }
    *(int *)((long)aiStack_68 + (long)res * 4 + lVar1 + 0x68) = aiStack_68[3];
    res = res + 1;
  }
  while (tmp_ptr <= M) {
    *(int *)((long)aiStack_68 + (long)res * 4 + lVar1 + 0x68) = arr[tmp_ptr];
    res = res + 1;
    tmp_ptr = tmp_ptr + 1;
  }
  while (tmp_arr_len <= R) {
    *(int *)((long)aiStack_68 + (long)res * 4 + lVar1 + 0x68) = arr[tmp_arr_len];
    res = res + 1;
    tmp_arr_len = tmp_arr_len + 1;
  }
  for (local_44 = 0; local_44 < (int)uVar2; local_44 = local_44 + 1) {
    arr[L + local_44] = *(int *)((long)aiStack_68 + (long)local_44 * 4 + lVar1 + 0x68);
  }
  return local_30;
}

Assistant:

int MinSum::merge(int *arr, int L, int M, int R) {
        int left_ptr = L,right_ptr = M + 1,tmp_ptr = 0,tmp_arr_len = R - L + 1,res = 0;
        int tmp_arr[tmp_arr_len];

        while (left_ptr <= M && right_ptr <= R){
            res += arr[left_ptr] < arr[right_ptr] ? arr[left_ptr] * (R - right_ptr + 1) : 0;
            tmp_arr[tmp_ptr++] = arr[left_ptr] < arr[right_ptr] ? arr[left_ptr ++] : arr[right_ptr++];
        }

        while (left_ptr <= M)
            tmp_arr[tmp_ptr ++] = arr[left_ptr++];

        while (right_ptr <= R)
            tmp_arr[tmp_ptr++] = arr[right_ptr++];

        for (int i = 0; i < tmp_arr_len; ++i) {
            arr[L + i] = tmp_arr[i];
        }

        return res;
    }